

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_AY_Stereo(VGMPlayer *this)

{
  byte bVar1;
  CHIP_DEVICE *pCVar2;
  CHIP_DEVICE *pCVar3;
  UINT8 chipType;
  DEVFUNC_OPTMASK writeStMask;
  code *local_28;
  
  bVar1 = this->_fileData[(ulong)this->_filePos + 1];
  chipType = '\x06';
  if ((bVar1 & 0x40) == 0) {
    chipType = '\x12';
  }
  pCVar2 = GetDevicePtr(this,chipType,bVar1 >> 7);
  local_28 = (code *)0x0;
  if (pCVar2 != (CHIP_DEVICE *)0x0) {
    pCVar3 = pCVar2;
    if ((bVar1 & 0x40) != 0) {
      pCVar3 = (CHIP_DEVICE *)(pCVar2->base).linkDev;
    }
    if (pCVar3 != (CHIP_DEVICE *)0x0) {
      SndEmu_GetDeviceFunc((pCVar3->base).defInf.devDef,'\0','\x01',0x5354,&local_28);
      if (local_28 != (code *)0x0) {
        (*local_28)((pCVar2->base).defInf.dataPtr,this->_fileData[(ulong)this->_filePos + 1] & 0x3f)
        ;
      }
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_AY_Stereo(void)
{
	UINT8 chipType = (fData[0x01] & 0x40) ? 0x06 : 0x12;	// YM2203 SSG or AY8910
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	VGM_BASEDEV* clDev;
	DEVFUNC_OPTMASK writeStMask = NULL;
	UINT8 retVal;
	
	if (cDev == NULL)
		return;
	if (chipType == 0x12)	// AY8910
		clDev = &cDev->base;
	else if (chipType == 0x06)	// YM2203 SSG
		clDev = cDev->base.linkDev;
	if (clDev == NULL)
		return;
	
	retVal = SndEmu_GetDeviceFunc(clDev->defInf.devDef, RWF_REGISTER | RWF_WRITE, DEVRW_ALL, 0x5354, (void**)&writeStMask);
	if (writeStMask != NULL)
		writeStMask(cDev->base.defInf.dataPtr, fData[0x01] & 0x3F);
	return;
}